

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

float __thiscall asmjit::Logger::logf(Logger *this,float __x)

{
  char in_AL;
  float extraout_XMM0_Da;
  va_list ap;
  Error err;
  __va_list_tag *in_stack_00000328;
  char *in_stack_00000330;
  Logger *in_stack_00000338;
  undefined1 auStack_e8 [48];
  float local_b8;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  Logger *local_8;
  
  local_28 = auStack_e8;
  if (in_AL != '\0') {
    local_b8 = __x;
  }
  local_30 = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x10;
  local_8 = this;
  logv(in_stack_00000338,in_stack_00000330,in_stack_00000328);
  return extraout_XMM0_Da;
}

Assistant:

Error Logger::logf(const char* fmt, ...) noexcept {
  Error err;

  va_list ap;
  va_start(ap, fmt);
  err = logv(fmt, ap);
  va_end(ap);

  return err;
}